

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.c
# Opt level: O3

_Bool rtree_new(rtree_t *rtree,_Bool zeroed)

{
  _Bool _Var1;
  
  _Var1 = malloc_mutex_init(&rtree->init_lock,"rtree",0x12,malloc_mutex_rank_exclusive);
  return _Var1;
}

Assistant:

bool
rtree_new(rtree_t *rtree, bool zeroed) {
#ifdef JEMALLOC_JET
	if (!zeroed) {
		memset(rtree, 0, sizeof(rtree_t)); /* Clear root. */
	}
#else
	assert(zeroed);
#endif

	if (malloc_mutex_init(&rtree->init_lock, "rtree", WITNESS_RANK_RTREE,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}

	return false;
}